

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingCompressionState<unsigned_long,_false,_long>::BitpackingCompressionState
          (BitpackingCompressionState<unsigned_long,_false,_long> *this,
          ColumnDataCheckpointData *checkpoint_data,CompressionInfo *info)

{
  CompressionFunction *pCVar1;
  RowGroup *pRVar2;
  DatabaseInstance *db;
  DBConfig *pDVar3;
  
  (this->super_CompressionState).info.block_manager = info->block_manager;
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__BitpackingCompressionState_027c0898;
  this->checkpoint_data = checkpoint_data;
  pCVar1 = ColumnDataCheckpointData::GetCompressionFunction(checkpoint_data,COMPRESSION_BITPACKING);
  this->function = pCVar1;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&this->handle);
  BitpackingState<unsigned_long,_long>::BitpackingState(&this->state);
  pRVar2 = ColumnDataCheckpointData::GetRowGroup(checkpoint_data);
  CreateEmptySegment(this,(pRVar2->super_SegmentBase<duckdb::RowGroup>).start);
  (this->state).data_ptr = this;
  db = ColumnDataCheckpointData::GetDatabase(checkpoint_data);
  pDVar3 = DBConfig::GetConfig(db);
  (this->state).mode = (pDVar3->options).force_bitpacking_mode;
  return;
}

Assistant:

explicit BitpackingCompressionState(ColumnDataCheckpointData &checkpoint_data, const CompressionInfo &info)
	    : CompressionState(info), checkpoint_data(checkpoint_data),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_BITPACKING)) {
		CreateEmptySegment(checkpoint_data.GetRowGroup().start);

		state.data_ptr = reinterpret_cast<void *>(this);

		auto &config = DBConfig::GetConfig(checkpoint_data.GetDatabase());
		state.mode = config.options.force_bitpacking_mode;
	}